

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall ethash_check_difficulty_check::test_method(ethash_check_difficulty_check *this)

{
  bool bVar1;
  undefined **local_240;
  ulong local_238;
  shared_count sStack_230;
  undefined1 **local_228;
  undefined1 local_220 [8];
  undefined8 local_218;
  shared_count sStack_210;
  ethash_h256_t target;
  ethash_h256_t hash;
  undefined1 local_1c8 [8];
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  undefined **local_180;
  undefined1 local_178;
  undefined8 *local_170;
  char *local_168;
  undefined **local_160;
  undefined1 local_158;
  undefined ***local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined **local_130;
  undefined1 local_128;
  undefined ***local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined **local_50;
  undefined1 local_48;
  undefined ***local_40;
  undefined1 **local_38;
  
  builtin_memcpy(hash.b,"11111111111111111111111111111111",0x20);
  builtin_memcpy(target.b,"22222222222222222222222222222222",0x20);
  local_60 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0xbd);
  local_220[0] = ethash_check_difficulty(&hash,&target);
  local_218 = 0;
  sStack_210.pi_ = (sp_counted_base *)0x0;
  local_178 = 0;
  local_180 = &PTR__lazy_ostream_0013a758;
  local_170 = &boost::unit_test::lazy_ostream::inst;
  local_168 = "\nexpected \"";
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,&hash,local_1c8);
  local_38 = &local_138;
  local_138 = local_1a0[0];
  local_150 = &local_50;
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_0013a8d8;
  local_40 = &local_180;
  local_158 = 0;
  local_160 = &PTR__lazy_ostream_0013afd8;
  local_148 = "\" to have the same or less difficulty than \"";
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,&target,&hash);
  local_228 = &local_140;
  local_140 = local_1c0[0];
  local_120 = &local_240;
  local_238 = local_238 & 0xffffffffffffff00;
  local_240 = &PTR__lazy_ostream_0013b018;
  sStack_230.pi_ = (sp_counted_base *)&local_160;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0013b058;
  local_118 = "\"\n";
  local_80 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_78 = "";
  boost::test_tools::tt_detail::report_assertion(local_220,&local_130,&local_80,0xbd,2,1,0);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::string::~string((string *)local_1a0);
  boost::detail::shared_count::~shared_count(&sStack_210);
  local_90 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0xbf);
  bVar1 = ethash_check_difficulty(&hash,&hash);
  local_238 = 0;
  sStack_230.pi_ = (sp_counted_base *)0x0;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0013aa18;
  local_120 = (undefined ***)&boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_b0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_a8 = "";
  local_240._0_1_ = bVar1;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_230);
  builtin_memcpy(target.b,"11111111111111111111111111111112",0x20);
  local_c0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0xc3);
  local_240._0_1_ = ethash_check_difficulty(&hash,&target);
  local_238 = 0;
  sStack_230.pi_ = (sp_counted_base *)0x0;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0013aa18;
  local_120 = (undefined ***)&boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_e0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_d8 = "";
  boost::test_tools::tt_detail::report_assertion(&local_240,&local_130,&local_e0,0xc3,2,1,0);
  boost::detail::shared_count::~shared_count(&sStack_230);
  builtin_memcpy(target.b,"11111111111111111111111111111110",0x20);
  local_f0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,199);
  bVar1 = ethash_check_difficulty(&hash,&target);
  local_240 = (undefined **)CONCAT71(local_240._1_7_,!bVar1);
  local_238 = 0;
  sStack_230.pi_ = (sp_counted_base *)0x0;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0013aa18;
  local_120 = (undefined ***)&boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_110 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_108 = "";
  boost::test_tools::tt_detail::report_assertion(&local_240,&local_130,&local_110,199,2,1,0);
  boost::detail::shared_count::~shared_count(&sStack_230);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(ethash_check_difficulty_check) {
	ethash_h256_t hash;
	ethash_h256_t target;
	memcpy(&hash, "11111111111111111111111111111111", 32);
	memcpy(&target, "22222222222222222222222222222222", 32);
	BOOST_REQUIRE_MESSAGE(
			ethash_check_difficulty(&hash, &target),
			"\nexpected \"" << std::string((char *) &hash, 32).c_str() << "\" to have the same or less difficulty than \"" << std::string((char *) &target, 32).c_str() << "\"\n");
	BOOST_REQUIRE_MESSAGE(
		ethash_check_difficulty(&hash, &hash), "");
			// "\nexpected \"" << hash << "\" to have the same or less difficulty than \"" << hash << "\"\n");
	memcpy(&target, "11111111111111111111111111111112", 32);
	BOOST_REQUIRE_MESSAGE(
		ethash_check_difficulty(&hash, &target), "");
			// "\nexpected \"" << hash << "\" to have the same or less difficulty than \"" << target << "\"\n");
	memcpy(&target, "11111111111111111111111111111110", 32);
	BOOST_REQUIRE_MESSAGE(
			!ethash_check_difficulty(&hash, &target), "");
			// "\nexpected \"" << hash << "\" to have more difficulty than \"" << target << "\"\n");
}